

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rbnf.cpp
# Opt level: O0

void __thiscall
icu_63::RuleBasedNumberFormat::stripWhitespace
          (RuleBasedNumberFormat *this,UnicodeString *description)

{
  undefined8 srcText;
  UBool UVar1;
  char16_t cVar2;
  int32_t iVar3;
  int32_t iVar4;
  bool bVar5;
  int32_t p;
  int local_5c;
  undefined1 local_58 [4];
  int start;
  UnicodeString result;
  UnicodeString *description_local;
  RuleBasedNumberFormat *this_local;
  
  result.fUnion._48_8_ = description;
  UnicodeString::UnicodeString((UnicodeString *)local_58);
  local_5c = 0;
  while( true ) {
    bVar5 = false;
    if (local_5c != -1) {
      iVar3 = UnicodeString::length((UnicodeString *)result.fUnion._48_8_);
      bVar5 = local_5c < iVar3;
    }
    if (!bVar5) break;
    while( true ) {
      iVar3 = UnicodeString::length((UnicodeString *)result.fUnion._48_8_);
      bVar5 = false;
      if (local_5c < iVar3) {
        cVar2 = UnicodeString::charAt((UnicodeString *)result.fUnion._48_8_,local_5c);
        UVar1 = PatternProps::isWhiteSpace((uint)(ushort)cVar2);
        bVar5 = UVar1 != '\0';
      }
      if (!bVar5) break;
      local_5c = local_5c + 1;
    }
    iVar3 = UnicodeString::indexOf((UnicodeString *)result.fUnion._48_8_,L';',local_5c);
    srcText = result.fUnion._48_8_;
    if (iVar3 == -1) {
      iVar3 = UnicodeString::length((UnicodeString *)result.fUnion._48_8_);
      UnicodeString::append
                ((UnicodeString *)local_58,(UnicodeString *)srcText,local_5c,iVar3 - local_5c);
      local_5c = -1;
    }
    else {
      iVar4 = UnicodeString::length((UnicodeString *)result.fUnion._48_8_);
      if (iVar3 < iVar4) {
        UnicodeString::append
                  ((UnicodeString *)local_58,(UnicodeString *)result.fUnion._48_8_,local_5c,
                   (iVar3 - local_5c) + 1);
        local_5c = iVar3 + 1;
      }
      else {
        local_5c = -1;
      }
    }
  }
  UnicodeString::setTo((UnicodeString *)result.fUnion._48_8_,(UnicodeString *)local_58);
  UnicodeString::~UnicodeString((UnicodeString *)local_58);
  return;
}

Assistant:

void
RuleBasedNumberFormat::stripWhitespace(UnicodeString& description)
{
    // iterate through the characters...
    UnicodeString result;

    int start = 0;
    while (start != -1 && start < description.length()) {
        // seek to the first non-whitespace character...
        while (start < description.length()
            && PatternProps::isWhiteSpace(description.charAt(start))) {
            ++start;
        }

        // locate the next semicolon in the text and copy the text from
        // our current position up to that semicolon into the result
        int32_t p = description.indexOf(gSemiColon, start);
        if (p == -1) {
            // or if we don't find a semicolon, just copy the rest of
            // the string into the result
            result.append(description, start, description.length() - start);
            start = -1;
        }
        else if (p < description.length()) {
            result.append(description, start, p + 1 - start);
            start = p + 1;
        }

        // when we get here, we've seeked off the end of the string, and
        // we terminate the loop (we continue until *start* is -1 rather
        // than until *p* is -1, because otherwise we'd miss the last
        // rule in the description)
        else {
            start = -1;
        }
    }

    description.setTo(result);
}